

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O1

void __thiscall TinyGC::Mark(TinyGC *this)

{
  bool bVar1;
  _Hash_node_base *p_Var2;
  Elf64_Ehdr *pEVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  __node_base_ptr p_Var7;
  ostream *poVar8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  __hash_code __code;
  _Hash_node_base *p_Var11;
  _Hash_node_base *p_Var12;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lck;
  
  local_40 = (undefined1  [8])&this->ts_mxt_;
  lck._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
  lck._M_device._0_1_ = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nMark Start~",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  if (this->gc_phase_ != kNone) {
    __assert_fail("gc_phase_ == GCPhase::kNone",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/v4kst1z[P]TinyGC/TinyGC.cpp"
                  ,0x4f,"void TinyGC::SetGCPhase(GCPhase)");
  }
  this->gc_phase_ = kMarking;
  this->visitor_->mark_ = true;
  p_Var11 = (this->thread_to_stack_)._M_h._M_before_begin._M_nxt;
  do {
    if (p_Var11 == (_Hash_node_base *)0x0) {
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
      return;
    }
    p_Var2 = p_Var11[2]._M_nxt;
    p_Var2[1]._M_nxt = (_Hash_node_base *)&stack0xfffffffffffffff8;
    p_Var2 = p_Var2->_M_nxt;
    for (p_Var12 = (_Hash_node_base *)&stack0xfffffffffffffff8; p_Var12 < p_Var2;
        p_Var12 = p_Var12 + 1) {
      pEVar3 = (Elf64_Ehdr *)p_Var12->_M_nxt;
      if (&Elf64_Ehdr_00100000 < pEVar3) {
        uVar4 = (this->objs_addr_)._M_h._M_bucket_count;
        uVar9 = (ulong)pEVar3 % uVar4;
        p_Var5 = (this->objs_addr_)._M_h._M_buckets[uVar9];
        p_Var7 = (__node_base_ptr)0x0;
        if ((p_Var5 != (__node_base_ptr)0x0) &&
           (p_Var7 = p_Var5, p_Var10 = p_Var5->_M_nxt,
           pEVar3 != (Elf64_Ehdr *)p_Var5->_M_nxt[1]._M_nxt)) {
          while (p_Var6 = p_Var10->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
            p_Var7 = (__node_base_ptr)0x0;
            if (((ulong)p_Var6[1]._M_nxt % uVar4 != uVar9) ||
               (p_Var7 = p_Var10, p_Var10 = p_Var6, pEVar3 == (Elf64_Ehdr *)p_Var6[1]._M_nxt))
            goto LAB_0010262f;
          }
          p_Var7 = (__node_base_ptr)0x0;
        }
LAB_0010262f:
        if ((p_Var7 != (__node_base_ptr)0x0) && (p_Var7->_M_nxt != (_Hash_node_base *)0x0)) {
          bVar1 = this->visitor_->mark_;
          if ((bool)pEVar3->e_ident_abiversion != bVar1) {
            pEVar3->e_ident_abiversion = bVar1;
            (*(code *)**(undefined8 **)&pEVar3->e_ident_magic_num)(pEVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"find object at ",0xf);
          *(uint *)(*(long *)(std::cerr + -0x18) + 0x10b190) =
               *(uint *)(*(long *)(std::cerr + -0x18) + 0x10b190) & 0xffffffb5 | 8;
          poVar8 = std::ostream::_M_insert<void_const*>(&std::cerr);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
      }
    }
    p_Var11 = p_Var11->_M_nxt;
  } while( true );
}

Assistant:

void TinyGC::Mark() {
  std::unique_lock<std::mutex> lck(ts_mxt_);
  LOG("\nMark Start~");
  SetGCPhase(GCPhase::kMarking);
  visitor_->SetMark(true);

  for (auto &ts_ : thread_to_stack_) {
    ThreadState *ts = ts_.second;
    ts->GetCurrentStackPosition();
    intptr_t **start = reinterpret_cast<intptr_t **>(ts->GetStackEndAddr());
    intptr_t **end = reinterpret_cast<intptr_t **>(ts->GetStackStartAddr());
    for (; start < end; start++) {
      if (*start > (intptr_t *)0x100000) {
        GarbageCollectedBase *ptr =
            reinterpret_cast<GarbageCollectedBase *>(*start);
        if (objs_addr_.find(ptr) != objs_addr_.end()) {
          visitor_->ObjTrace((GarbageCollectedBase *)ptr);
          LOG("find object at " << std::hex << ptr);
        }
      }
    }
  }
}